

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

void pg::mark_solved_rec_WRAP(WorkerP *w,Task *__dq_head,TD_mark_solved_rec *t)

{
  int iVar1;
  
  iVar1 = mark_solved_rec_CALL(w,__dq_head,(t->d).args.arg_1,(t->d).args.arg_2,(t->d).args.arg_3);
  (t->d).res = iVar1;
  return;
}

Assistant:

TASK_3(int, mark_solved_rec, PSISolver*, s, int, begin, int, count)
{
    // some cut-off point...
    if (count < 64) {
        int res = 0;
        for (int i=0; i<count; i++) {
            int n = begin+i;
            if (done[n] == 2) { // done[n] == 3 proxies disabled and won
                won[n] = 1;
                done[n] = 3; // mark as won
                res++;
            }
        }
        return res;
    } else {
        SPAWN(mark_solved_rec, s, begin+count/2, count-count/2);
        int res = CALL(mark_solved_rec, s, begin, count/2);
        return res + SYNC(mark_solved_rec);
    }
}